

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldLiteGenerator::
ImmutableLazyMessageOneofFieldLiteGenerator
          (ImmutableLazyMessageOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  OneofGeneratorInfo *this_00;
  OneofDescriptor *oneof;
  mapped_type *this_01;
  allocator<char> local_61;
  key_type local_60;
  OneofGeneratorInfo *local_30;
  OneofGeneratorInfo *info;
  Context *context_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  ImmutableLazyMessageOneofFieldLiteGenerator *this_local;
  
  info = (OneofGeneratorInfo *)context;
  context_local._0_4_ = builderBitIndex;
  context_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  ImmutableLazyMessageFieldLiteGenerator::ImmutableLazyMessageFieldLiteGenerator
            (&this->super_ImmutableLazyMessageFieldLiteGenerator,descriptor,messageBitIndex,
             builderBitIndex,context);
  this_00 = info;
  (this->super_ImmutableLazyMessageFieldLiteGenerator).super_ImmutableMessageFieldLiteGenerator.
  super_ImmutableFieldLiteGenerator._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableLazyMessageOneofFieldLiteGenerator_006f80f8;
  oneof = FieldDescriptor::containing_oneof(_builderBitIndex_local);
  local_30 = Context::GetOneofGeneratorInfo((Context *)this_00,oneof);
  SetCommonOneofVariables
            (_builderBitIndex_local,local_30,
             &(this->super_ImmutableLazyMessageFieldLiteGenerator).
              super_ImmutableMessageFieldLiteGenerator.variables_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"lazy_type",&local_61);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&(this->super_ImmutableLazyMessageFieldLiteGenerator).
                          super_ImmutableMessageFieldLiteGenerator.variables_,&local_60);
  std::__cxx11::string::operator=((string *)this_01,"com.google.protobuf.LazyFieldLite");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

ImmutableLazyMessageOneofFieldLiteGenerator::
ImmutableLazyMessageOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                            int messageBitIndex,
                                            int builderBitIndex,
                                            Context* context)
    : ImmutableLazyMessageFieldLiteGenerator(
          descriptor, messageBitIndex, builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
  variables_["lazy_type"] = "com.google.protobuf.LazyFieldLite";
}